

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

void __thiscall tonk::SDKConnection::~SDKConnection(SDKConnection *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  this->_vptr_SDKConnection = (_func_int **)&PTR__SDKConnection_001b7c10;
  if (this->MyConnection != (TonkConnection)0x0) {
    tonk_free(this->MyConnection);
    this->MyConnection = (TonkConnection)0x0;
  }
  p_Var2 = (this->SelfReference).super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_enable_shared_from_this<tonk::SDKConnection>)._M_weak_this.
           super___weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

SDKConnection::~SDKConnection()
{
    if (MyConnection != nullptr)
    {
        tonk_free(MyConnection);
        MyConnection = nullptr;
    }
}